

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

int waitconnect_getsock(connectdata *conn,curl_socket_t *sock)

{
  uint local_2c;
  int local_28;
  int rc;
  int s;
  int i;
  curl_socket_t *sock_local;
  connectdata *conn_local;
  
  local_28 = 0;
  local_2c = 0;
  if (((conn->http_proxy).proxytype == '\x02') && (((conn->bits).proxy_ssl_connected[0] & 1U) == 0))
  {
    conn_local._4_4_ = (*Curl_ssl->getsock)(conn,sock);
  }
  else if (((conn->cnnct).state == CONNECT_INIT) || (CONNECT_REQ_READ_MORE < (conn->cnnct).state)) {
    for (rc = 0; rc < 2; rc = rc + 1) {
      if (conn->tempsock[rc] != -1) {
        sock[local_28] = conn->tempsock[rc];
        local_2c = 1 << ((char)local_28 + 0x10U & 0x1f) | local_2c;
        local_28 = local_28 + 1;
      }
    }
    conn_local._4_4_ = local_2c;
  }
  else {
    conn_local._4_4_ = Curl_SOCKS_getsock(conn,sock,0);
  }
  return conn_local._4_4_;
}

Assistant:

static int waitconnect_getsock(struct connectdata *conn,
                               curl_socket_t *sock)
{
  int i;
  int s = 0;
  int rc = 0;

#ifdef USE_SSL
#ifndef CURL_DISABLE_PROXY
  if(CONNECT_FIRSTSOCKET_PROXY_SSL())
    return Curl_ssl->getsock(conn, sock);
#endif
#endif

  if(SOCKS_STATE(conn->cnnct.state))
    return Curl_SOCKS_getsock(conn, sock, FIRSTSOCKET);

  for(i = 0; i<2; i++) {
    if(conn->tempsock[i] != CURL_SOCKET_BAD) {
      sock[s] = conn->tempsock[i];
      rc |= GETSOCK_WRITESOCK(s);
#ifdef ENABLE_QUIC
      if(conn->transport == TRNSPRT_QUIC)
        /* when connecting QUIC, we want to read the socket too */
        rc |= GETSOCK_READSOCK(s);
#endif
      s++;
    }
  }

  return rc;
}